

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O3

vector<long,_std::allocator<long>_> *
CoreML::defaultSizeOf
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,ImageFeatureType *params)

{
  uint uVar1;
  vector<long,_std::allocator<long>_> *extraout_RAX;
  SizeRange *pSVar2;
  ImageFeatureType_ImageSizeRange *pIVar3;
  ImageFeatureType_EnumeratedImageSizes *pIVar4;
  LogMessage *pLVar5;
  vector<long,_std::allocator<long>_> *extraout_RAX_00;
  vector<long,_std::allocator<long>_> *extraout_RAX_01;
  iterator iVar6;
  pointer *pplVar7;
  LogFinisher local_69;
  vector<long,_std::allocator<long>_> *local_68;
  LogMessage local_60;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60._0_8_ = params->width_;
  if ((0 < (long)local_60._0_8_) && (0 < params->height_)) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (__return_storage_ptr__,(iterator)0x0,(long *)&local_60);
    local_60._0_8_ = params->height_;
    iVar6._M_current =
         (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                (__return_storage_ptr__,iVar6,(long *)&local_60);
      return extraout_RAX;
    }
LAB_00273db0:
    *iVar6._M_current = local_60._0_8_;
    (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)((uint64 *)iVar6._M_current + 1);
    return (vector<long,_std::allocator<long>_> *)local_60._0_8_;
  }
  uVar1 = params->_oneof_case_[0];
  if (uVar1 == 0x1f) {
    pSVar2 = ((params->SizeFlexibility_).imagesizerange_)->widthrange_;
    if (pSVar2 == (SizeRange *)0x0) {
      pSVar2 = (SizeRange *)&Specification::_SizeRange_default_instance_;
    }
    local_60._0_8_ = pSVar2->lowerbound_;
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (__return_storage_ptr__,(iterator)0x0,(long *)&local_60);
    if (params->_oneof_case_[0] == 0x1f) {
      pIVar3 = (params->SizeFlexibility_).imagesizerange_;
    }
    else {
      pIVar3 = Specification::ImageFeatureType_ImageSizeRange::default_instance();
    }
    pSVar2 = pIVar3->heightrange_;
    if (pSVar2 == (SizeRange *)0x0) {
      pSVar2 = (SizeRange *)&Specification::_SizeRange_default_instance_;
    }
    local_60._0_8_ = pSVar2->lowerbound_;
    iVar6._M_current =
         (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                (__return_storage_ptr__,iVar6,(long *)&local_60);
      return extraout_RAX_00;
    }
    goto LAB_00273db0;
  }
  if (uVar1 != 0x15) {
    return (vector<long,_std::allocator<long>_> *)(ulong)uVar1;
  }
  pIVar4 = (params->SizeFlexibility_).enumeratedsizes_;
  if ((pIVar4->sizes_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    pLVar5 = google::protobuf::internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_69,pLVar5);
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
    iVar6._M_current =
         (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    local_68 = *(vector<long,_std::allocator<long>_> **)
                ((long)((pIVar4->sizes_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x10);
    if (iVar6._M_current !=
        (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      *iVar6._M_current = (long)local_68;
      (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      goto LAB_00273e34;
    }
  }
  else {
    local_68 = *(vector<long,_std::allocator<long>_> **)
                ((long)((pIVar4->sizes_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x10);
    iVar6._M_current = (long *)0x0;
  }
  std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
            (__return_storage_ptr__,iVar6,(long *)&local_68);
LAB_00273e34:
  pplVar7 = &(__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (params->_oneof_case_[0] == 0x15) {
    pIVar4 = (params->SizeFlexibility_).enumeratedsizes_;
  }
  else {
    pIVar4 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
  }
  if ((pIVar4->sizes_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    pLVar5 = google::protobuf::internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_69,pLVar5);
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  local_68 = *(vector<long,_std::allocator<long>_> **)
              ((long)((pIVar4->sizes_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18);
  iVar6._M_current = *pplVar7;
  if (iVar6._M_current !=
      (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    *iVar6._M_current = (long)local_68;
    *pplVar7 = iVar6._M_current + 1;
    return local_68;
  }
  std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
            (__return_storage_ptr__,iVar6,(long *)&local_68);
  return extraout_RAX_01;
}

Assistant:

static std::vector<int64_t> defaultSizeOf(const Specification::ImageFeatureType &params) {
        std::vector<int64_t> defaultSize;

        if (params.width() > 0 && params.height() > 0) {
            defaultSize.push_back((int64_t)params.width());
            defaultSize.push_back((int64_t)params.height());
            return defaultSize;
        }

        switch (params.SizeFlexibility_case()) {
            case Specification::ImageFeatureType::kEnumeratedSizes:
                defaultSize.push_back((int64_t)params.enumeratedsizes().sizes(0).width());
                defaultSize.push_back((int64_t)params.enumeratedsizes().sizes(0).height());
                break;
            case Specification::ImageFeatureType::kImageSizeRange:
                defaultSize.push_back((int64_t)params.imagesizerange().widthrange().lowerbound());
                defaultSize.push_back((int64_t)params.imagesizerange().heightrange().lowerbound());
                break;
            case Specification::ImageFeatureType::SIZEFLEXIBILITY_NOT_SET:
                break;
        }
        return defaultSize;
    }